

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::ArrayBuilder<kj::Array<unsigned_char>_>::~ArrayBuilder
          (ArrayBuilder<kj::Array<unsigned_char>_> *this)

{
  Array<unsigned_char> *pAVar1;
  RemoveConst<kj::Array<unsigned_char>_> *pRVar2;
  Array<unsigned_char> *pAVar3;
  
  pAVar1 = this->ptr;
  if (pAVar1 != (Array<unsigned_char> *)0x0) {
    pRVar2 = this->pos;
    pAVar3 = this->endPtr;
    this->ptr = (Array<unsigned_char> *)0x0;
    this->pos = (RemoveConst<kj::Array<unsigned_char>_> *)0x0;
    this->endPtr = (Array<unsigned_char> *)0x0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,pAVar1,0x18,((long)pRVar2 - (long)pAVar1 >> 3) * -0x5555555555555555,
               ((long)pAVar3 - (long)pAVar1 >> 3) * -0x5555555555555555,
               ArrayDisposer::Dispose_<kj::Array<unsigned_char>_>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }